

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

uint8 * __thiscall
Messages::Person_PhoneNumber::_InternalSerialize
          (Person_PhoneNumber *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int size;
  Person_PhoneType value;
  uint32 value_00;
  char *data;
  string *s;
  uint8 *puVar2;
  Container<google::protobuf::UnknownFieldSet> *pCVar3;
  uint32 cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  Person_PhoneNumber *this_local;
  UnknownFieldSet *local_58;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    _internal_number_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    _internal_number_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"Messages.Person.PhoneNumber.number");
    s = _internal_number_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,s,target);
  }
  if ((uVar1 & 2) != 0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    value = _internal_type(this);
    value_00 = google::protobuf::internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    puVar2 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(value_00,puVar2);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                             (value,puVar2);
  }
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
      pCVar3 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)&this->field_0x8);
      local_58 = &pCVar3->unknown_fields;
    }
    else {
      local_58 = (UnknownFieldSet *)google::protobuf::UnknownFieldSet::default_instance();
    }
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (local_58,(uchar *)stream_local,stream);
  }
  return (uint8 *)stream_local;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Person_PhoneNumber::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:Messages.Person.PhoneNumber)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // required string number = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_number().data(), static_cast<int>(this->_internal_number().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "Messages.Person.PhoneNumber.number");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_number(), target);
  }

  // optional .Messages.Person.PhoneType type = 2 [default = HOME];
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_type(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:Messages.Person.PhoneNumber)
  return target;
}